

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O2

void __thiscall EthernetLink::EthernetLink(EthernetLink *this,char *name)

{
  Link::Link(&this->super_Link,name);
  (this->super_Link).super_Entity._vptr_Entity = (_func_int **)&PTR__EthernetLink_0012b560;
  (this->_interfaces).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_interfaces).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_interfaces).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_contending).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_contending).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_contending).super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   ((long)&(this->_contending).
           super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 7) = 0;
  this->_contention_period = 10;
  this->_message = (Message *)0x0;
  MetaSim::GEvent<EthernetLink>::GEvent(&this->_end_contention_evt,this,0x117b52,0);
  MetaSim::GEvent<EthernetLink>::GEvent(&this->_collision_evt,this,0x117ba4,0);
  MetaSim::GEvent<EthernetLink>::GEvent(&this->_end_transmission_evt,this,0x117bda,0);
  return;
}

Assistant:

EthernetLink::EthernetLink(const char *name) 
    : Link(name), _interfaces(), _contending(), 
      _isBusy(false),
      _isContending(false),
      _isCollision(false),
      _contention_period(10),
      _message(0),
      _end_contention_evt(this, &EthernetLink::onEndContention),
      _collision_evt(this, &EthernetLink::onCollision),
      _end_transmission_evt(this, &EthernetLink::onEndTransmission)
{
    //register_handler(_end_contention_evt, this, &EthernetLink::onEndContention);
    //register_handler(_collision_evt, this, &EthernetLink::onCollision);
    //register_handler(_end_transmission_evt, this, &EthernetLink::onEndTransmission);
}